

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::http_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>
          (http_stream *this,error_code *e,anon_class_16_1_898a5c2a *h)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  read_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__http_stream_hpp:188:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>_>
  local_78;
  error_code local_38;
  
  bVar3 = proxy_base::handle_error<libtorrent::aux::peer_connection::start()::__0&>
                    (&this->super_proxy_base,e,h);
  if (!bVar3) {
    this_00 = &this->m_buffer;
    pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar1;
    if (((uVar6 < 3) || (pcVar1[uVar6 - 1] != '\n')) ||
       ((pcVar1[uVar6 - 2] != '\n' &&
        (((pcVar1[uVar6 - 2] != '\r' || uVar6 < 5 || (pcVar1[uVar6 - 3] != '\n')) ||
         (pcVar1[uVar6 - 4] != '\r')))))) {
      ::std::vector<char,_std::allocator<char>_>::resize(this_00,uVar6 + 1);
      local_78.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.data_ =
           (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar6;
      local_78.handler_.m_underlying_handler.conn.
      super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (h->conn).
           super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.handler_.m_underlying_handler.conn.
      super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (h->conn).
              super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      (h->conn).super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (h->conn).super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.size_ = 1
      ;
      local_78.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.total_consumed_ =
           0;
      local_78.start_ = 0;
      local_38.val_ = 0;
      local_38.failed_ = false;
      local_38.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      local_78.stream_ =
           (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
            *)this;
      local_78.handler_.m_handler.this = this;
      boost::asio::detail::
      read_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/http_stream.hpp:188:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>_>
      ::operator()(&local_78,&local_38,0,1);
      if (local_78.handler_.m_underlying_handler.conn.
          super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.handler_.m_underlying_handler.conn.
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      local_78.stream_ =
           (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
            *)((ulong)local_78.stream_ & 0xffffffffffffff00);
      ::std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,(char *)&local_78);
      pcVar5 = strchr((this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start,0x20);
      if ((pcVar5 != (char *)0x0) && (iVar4 = atoi(pcVar5 + 1), iVar4 == 200)) {
        peer_connection::
        wrap<void(libtorrent::aux::peer_connection::*)(boost::system::error_code_const&),boost::system::error_code_const&>
                  ((h->conn).
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,0x25114c,(error_code *)0x0);
        pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pcVar1 == (pointer)0x0) {
          return;
        }
        operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
        return;
      }
      local_78.stream_ =
           (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
            *)0x10000005f;
      local_78.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.data_ =
           &boost::system::detail::cat_holder<void>::system_category_instance;
      peer_connection::
      wrap<void(libtorrent::aux::peer_connection::*)(boost::system::error_code_const&),boost::system::error_code_const&>
                ((h->conn).
                 super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,0x25114c,(error_code *)0x0);
      local_78.stream_ =
           (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
            *)((ulong)local_78.stream_ & 0xffffff0000000000);
      local_78.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.data_ =
           &boost::system::detail::cat_holder<void>::system_category_instance;
      close(this,(int)&local_78);
    }
  }
  return;
}

Assistant:

void handshake2(error_code const& e, Handler h)
	{
		if (handle_error(e, h)) return;

		std::size_t const read_pos = m_buffer.size();
		// look for \n\n and \r\n\r\n
		// both of which means end of http response header
		bool found_end = false;
		if (read_pos > 2 && m_buffer[read_pos - 1] == '\n')
		{
			if (m_buffer[read_pos - 2] == '\n')
			{
				found_end = true;
			}
			else if (read_pos > 4
				&& m_buffer[read_pos - 2] == '\r'
				&& m_buffer[read_pos - 3] == '\n'
				&& m_buffer[read_pos - 4] == '\r')
			{
				found_end = true;
			}
		}

		if (found_end)
		{
			m_buffer.push_back(0);
			char const* status = std::strchr(m_buffer.data(), ' ');
			if (status == nullptr)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			status++;
			int const code = std::atoi(status);
			if (code != 200)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		// read another byte from the socket
		m_buffer.resize(read_pos + 1);
		async_read(m_sock, boost::asio::buffer(m_buffer.data() + read_pos, 1), wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				handshake2(ec, std::move(hn));
			}, std::move(h)));
	}